

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    X_local._4_4_ = -10;
  }
  else {
    X->s = 1;
    X_local._4_4_ = mbedtls_mpi_grow(X,A->n);
    if (X_local._4_4_ == 0) {
      mpi_sub_hlp(X,A,B);
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;
    ret = 0;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, A->n ) );
    mpi_sub_hlp( X, A, B );

cleanup:
    return( ret );
}